

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool WindowedKeyTest<Blob<258>,Blob<128>>
               (hashfunc<Blob<128>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int i;
  ulong uVar4;
  uint uVar5;
  uint c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  Blob<258> local_72;
  Blob<258> key;
  
  uVar5 = 1 << (windowbits & 0x1fU);
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize(&hashes,(long)(int)uVar5);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x108,
         (ulong)(uint)windowbits,0x108);
  bVar2 = true;
  for (c = 0; c != 0x109; c = c + 1) {
    Blob<258>::Blob(&key);
    lVar3 = 0;
    for (uVar4 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar4; uVar4 = uVar4 + 1) {
      Blob<258>::Blob(&local_72,(int)uVar4);
      Blob<258>::operator=(&key,&local_72);
      lrot8(&key,0x21,c);
      (*hash.m_hash)(&key,0x21,0,
                     (hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                      super__Vector_impl_data._M_start)->bytes + lVar3);
      lVar3 = lVar3 + 0x10;
    }
    printf("Window at %3d - ",(ulong)c);
    bVar1 = TestHashList<Blob<128>>(&hashes,drawDiagram,testCollision,testDistribution,false,false);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  std::_Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>);
  return bVar2;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}